

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

void Sfm_DecPrepareVec(Vec_Int_t *vMap,int *pNodes,int nNodes,Vec_Int_t *vCut)

{
  int iVar1;
  ulong uVar2;
  
  vCut->nSize = 0;
  if (0 < nNodes) {
    uVar2 = 0;
    do {
      iVar1 = pNodes[uVar2];
      if (((long)iVar1 < 0) || (vMap->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(vCut,vMap->pArray[iVar1]);
      uVar2 = uVar2 + 1;
    } while ((uint)nNodes != uVar2);
  }
  return;
}

Assistant:

void Sfm_DecPrepareVec( Vec_Int_t * vMap, int * pNodes, int nNodes, Vec_Int_t * vCut )
{
    int i;
    Vec_IntClear( vCut );
    for ( i = 0; i < nNodes; i++ )
        Vec_IntPush( vCut, Vec_IntEntry(vMap, pNodes[i]) );    
}